

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

enable_if_t<HasSize<vector<Image>_>::value_&&_HasData<vector<Image>_>::value,_std::ostream_&>
pbrt::detail::operator<<
          (ostream *os,vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *v)

{
  size_t sVar1;
  ostream *poVar2;
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> *in_RSI;
  ostream *in_RDI;
  Image *in_stack_00000008;
  ostream *in_stack_00000010;
  size_t i;
  const_pointer ptr;
  ulong local_20;
  
  std::operator<<(in_RDI,"[ ");
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::data(in_RSI);
  local_20 = 0;
  while( true ) {
    sVar1 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::size(in_RSI);
    if (sVar1 <= local_20) break;
    pbrt::operator<<(in_stack_00000010,in_stack_00000008);
    sVar1 = pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::size(in_RSI);
    if (local_20 < sVar1 - 1) {
      std::operator<<(in_RDI,", ");
    }
    local_20 = local_20 + 1;
  }
  poVar2 = std::operator<<(in_RDI," ]");
  return poVar2;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}